

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Vec_t * Abc_NtkLevelize(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Vec_t *p;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *Entry;
  int i;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = Abc_NtkLevel(pNtk);
  uVar3 = iVar1 + 1;
  p = Vec_VecAlloc(uVar3);
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pVVar2 = Vec_PtrAlloc(0);
    p->pArray[uVar4] = pVVar2;
  }
  p->nSize = uVar3;
  i = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      return p;
    }
    Entry = Abc_NtkObj(pNtk,i);
    if ((Entry != (Abc_Obj_t *)0x0) && ((*(uint *)&Entry->field_0x14 & 0xf) == 7)) {
      uVar3 = *(uint *)&Entry->field_0x14 >> 0xc;
      if (iVar1 < (int)uVar3) {
        __assert_fail("(int)pObj->Level <= nLevels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x598,"Vec_Vec_t *Abc_NtkLevelize(Abc_Ntk_t *)");
      }
      Vec_VecPush(p,uVar3,Entry);
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Vec_t * Abc_NtkLevelize( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, i;
    nLevels = Abc_NtkLevel( pNtk );
    vLevels = Vec_VecStart( nLevels + 1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        assert( (int)pObj->Level <= nLevels );
        Vec_VecPush( vLevels, pObj->Level, pObj );
    }
    return vLevels;
}